

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webvttparser.cc
# Opt level: O0

bool __thiscall libwebvtt::Time::operator==(Time *this,Time *rhs)

{
  Time *rhs_local;
  Time *this_local;
  
  if (this->hours == rhs->hours) {
    if (this->minutes == rhs->minutes) {
      if (this->seconds == rhs->seconds) {
        this_local._7_1_ = this->milliseconds == rhs->milliseconds;
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Time::operator==(const Time& rhs) const {
  if (hours != rhs.hours)
    return false;

  if (minutes != rhs.minutes)
    return false;

  if (seconds != rhs.seconds)
    return false;

  return (milliseconds == rhs.milliseconds);
}